

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeAddrMode6Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = Val >> 4 & 3;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Val & 0xf]);
  uVar2 = 4 << (sbyte)uVar1;
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeAddrMode6Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned align = fieldFromInstruction_4(Val, 4, 2);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!align)
		MCOperand_CreateImm0(Inst, 0);
	else
		MCOperand_CreateImm0(Inst, 4 << align);

	return S;
}